

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

void __thiscall r_exec::View::set(View *this,uint16_t member_index,double value)

{
  undefined6 in_register_00000032;
  
  switch((int)CONCAT62(in_register_00000032,member_index)) {
  case 3:
    set_sln(this,value);
    return;
  case 4:
    set_res(this,value);
    return;
  default:
    return;
  case 7:
    set_act(this,value);
    return;
  case 8:
    set_vis(this,value);
    return;
  }
}

Assistant:

void View::set(uint16_t member_index, double value)
{
    switch (member_index) {
    case VIEW_SLN:
        set_sln(value);
        break;

    case VIEW_RES:
        set_res(value);
        break;

    case VIEW_ACT:
        set_act(value);
        break;

    case GRP_VIEW_VIS:
        set_vis(value);
        break;
    }
}